

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

char __thiscall fmt::v11::basic_specs::fill_unit<char>(basic_specs *this)

{
  basic_specs *this_local;
  
  return (char)*(undefined2 *)this->fill_data_;
}

Assistant:

constexpr auto fill_unit() const -> Char {
    using uchar = unsigned char;
    return static_cast<Char>(static_cast<uchar>(fill_data_[0]) |
                             (static_cast<uchar>(fill_data_[1]) << 8) |
                             (static_cast<uchar>(fill_data_[2]) << 16));
  }